

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

void __thiscall CP::queue<int>::print(queue<int> *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  queue<int> x;
  queue<int> local_40;
  
  queue(&local_40,this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Queue size = ",0xd);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," Data = ",8);
  while (local_40.mSize != 0) {
    piVar3 = front(&local_40);
    iVar1 = *piVar3;
    pop(&local_40);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  if (local_40.mData != (int *)0x0) {
    operator_delete__(local_40.mData);
  }
  return;
}

Assistant:

void print() {
      CP::queue<T> x(*this);
      std::cout << "Queue size = " << x.size() << " Data = ";
      while (x.empty() == false) {
        T a;
        a = x.front();
        x.pop();
        std::cout << a << " ";
      }
      std::cout << std::endl;
    }